

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O3

uc_err reg_write_ppc64(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uint uVar1;
  long lVar2;
  
  if (regid - 2 < 0x20) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)((long)_env + (ulong)(regid - 2) * 8) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x2a < 0x20) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)((long)_env + (ulong)(regid - 0x2a) * 0x10 + 0x12b28) = *value;
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x22 < 8) {
    if (3 < *size) {
      *size = 4;
      *(uint *)((long)_env + (ulong)(regid - 0x22) * 4 + 0x210) = *value & 0xf;
      return UC_ERR_OK;
    }
  }
  else {
    switch(regid) {
    case 0x4a:
      if (7 < *size) {
        *size = 8;
        *(undefined8 *)((long)_env + 0x200) = *value;
        return UC_ERR_OK;
      }
      break;
    case 0x4b:
      if (3 < *size) {
        *size = 4;
        *(ulong *)((long)_env + 0x238) = (ulong)*value;
        return UC_ERR_OK;
      }
      break;
    case 0x4c:
      if (7 < *size) {
        *size = 8;
        *(undefined8 *)((long)_env + 0x208) = *value;
        return UC_ERR_OK;
      }
      break;
    case 0x4d:
      if (7 < *size) {
        *size = 8;
        uc_ppc_store_msr((CPUPPCState_conflict1 *)_env,(target_ulong_conflict)*value,0xdb2cc0);
        return UC_ERR_OK;
      }
      break;
    case 0x4e:
      if (3 < *size) {
        *size = 4;
        store_fpscr((CPUPPCState_conflict *)_env,(ulong)*value,0xffffffff);
        return UC_ERR_OK;
      }
      break;
    case 0x4f:
      if (3 < *size) {
        *size = 4;
        uVar1 = *value;
        lVar2 = 0;
        do {
          *(uint *)((long)_env + lVar2 * 4 + 0x22c) = uVar1 & 0xf;
          uVar1 = uVar1 >> 4;
          lVar2 = lVar2 + -1;
        } while (lVar2 != -8);
        return UC_ERR_OK;
      }
      break;
    default:
      if (regid != 1) {
        return UC_ERR_ARG;
      }
      if (7 < *size) {
        *size = 8;
        *(undefined8 *)((long)_env + 0x2a8) = *value;
        *setpc = 1;
        return UC_ERR_OK;
      }
    }
  }
  return UC_ERR_OVERFLOW;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUPPCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_PPC_REG_0 && regid <= UC_PPC_REG_31) {
        CHECK_REG_TYPE(ppcreg_t);
        env->gpr[regid - UC_PPC_REG_0] = *(ppcreg_t *)value;
    } else if (regid >= UC_PPC_REG_FPR0 && regid <= UC_PPC_REG_FPR31) {
        CHECK_REG_TYPE(uint64_t);
        env->vsr[regid - UC_PPC_REG_FPR0].VsrD(0) = *(uint64_t *)value;
    } else if (regid >= UC_PPC_REG_CR0 && regid <= UC_PPC_REG_CR7) {
        CHECK_REG_TYPE(uint32_t);
        env->crf[regid - UC_PPC_REG_CR0] = (*(uint32_t *)value) & 0b1111;
    } else {
        switch (regid) {
        default:
            break;
        case UC_PPC_REG_PC:
            CHECK_REG_TYPE(ppcreg_t);
            env->nip = *(ppcreg_t *)value;
            *setpc = 1;
            break;
        case UC_PPC_REG_CR: {
            CHECK_REG_TYPE(uint32_t);
            int i;
            uint32_t val = *(uint32_t *)value;
            for (i = 7; i >= 0; i--) {
                env->crf[i] = val & 0b1111;
                val >>= 4;
            }
            break;
        }
        case UC_PPC_REG_LR:
            CHECK_REG_TYPE(ppcreg_t);
            env->lr = *(ppcreg_t *)value;
            break;
        case UC_PPC_REG_CTR:
            CHECK_REG_TYPE(ppcreg_t);
            env->ctr = *(ppcreg_t *)value;
            break;
        case UC_PPC_REG_MSR:
            CHECK_REG_TYPE(ppcreg_t);
            uc_ppc_store_msr(env, *(ppcreg_t *)value, 0);
            break;
        case UC_PPC_REG_XER:
            CHECK_REG_TYPE(uint32_t);
            env->xer = *(uint32_t *)value;
            break;
        case UC_PPC_REG_FPSCR:
            CHECK_REG_TYPE(uint32_t);
            store_fpscr(env, *(uint32_t *)value, 0xffffffff);
            break;
        }
    }

    return ret;
}